

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O0

void __thiscall DirectionCone_BoundBounds_Test::TestBody(DirectionCone_BoundBounds_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  float fVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  double dVar8;
  undefined1 auVar9 [64];
  Vector3f VVar11;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  bool hit;
  Ray r;
  Vector3f w;
  Point2f u;
  int j;
  Vector3f wy;
  Vector3f wx;
  AssertionResult gtest_ar_3;
  Point3f p;
  Bounds3f b_1;
  int i;
  RNG rng;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  Float precise;
  Float theta;
  AssertionResult gtest_ar;
  DirectionCone c;
  Bounds3f b;
  AssertionResult *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  AssertionResult *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  Point3f *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  float in_stack_fffffffffffffcb4;
  Point3<float> *in_stack_fffffffffffffcb8;
  Bounds3<float> *in_stack_fffffffffffffcc0;
  AssertionResult *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  Bounds3f *in_stack_fffffffffffffcf0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffd00;
  AssertionResult *in_stack_fffffffffffffd08;
  AssertHelper *in_stack_fffffffffffffd10;
  AssertHelper *this_01;
  double *val2;
  float *val1;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffd58;
  string local_2a0 [48];
  AssertionResult local_270;
  string local_260 [48];
  AssertionResult local_230;
  undefined1 local_219;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  Point3<float> local_1cc [4];
  undefined4 local_194;
  AssertionResult local_190;
  undefined8 local_17c;
  ulong local_174;
  undefined1 local_16c;
  Point3<float> local_168 [3];
  Bounds3<float> local_144;
  int local_12c;
  Point3f local_128 [2];
  double local_108;
  AssertionResult local_100 [2];
  double local_e0;
  AssertionResult local_d8;
  float local_c8;
  undefined4 local_c4;
  AssertHelper local_c0;
  undefined8 local_b4;
  ulong uStack_ac;
  undefined1 local_a4;
  undefined4 local_7c;
  AssertionResult local_78;
  float local_64 [3];
  undefined8 local_58;
  ulong uStack_50;
  undefined1 local_48;
  double local_20 [4];
  undefined1 auVar10 [56];
  
  pbrt::Point3<float>::Point3
            ((Point3<float> *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (float)((ulong)in_stack_fffffffffffffc88 >> 0x20),SUB84(in_stack_fffffffffffffc88,0),
             0.0);
  pbrt::Point3<float>::Point3
            ((Point3<float> *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (float)((ulong)in_stack_fffffffffffffc88 >> 0x20),SUB84(in_stack_fffffffffffffc88,0),
             0.0);
  val2 = local_20;
  pbrt::Bounds3<float>::Bounds3
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (Point3<float> *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  val1 = local_64;
  pbrt::Point3<float>::Point3
            ((Point3<float> *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (float)((ulong)in_stack_fffffffffffffc88 >> 0x20),SUB84(in_stack_fffffffffffffc88,0),
             0.0);
  pbrt::BoundSubtendedDirections
            (in_stack_fffffffffffffcf0,
             (Point3f *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  dVar8 = std::cos(SUB648(ZEXT464(0x40490fdb),0));
  local_7c = SUB84(dVar8,0);
  this_02 = &local_78;
  testing::internal::EqHelper<false>::Compare<float,float>
            ((char *)in_stack_fffffffffffffca8,
             (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
             (float *)in_stack_fffffffffffffc98,
             (float *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x6811ca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcc0,
               (Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd10,(Message *)in_stack_fffffffffffffd08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    testing::Message::~Message((Message *)0x68122d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x681285);
  this_01 = &local_c0;
  pbrt::Point3<float>::Point3
            ((Point3<float> *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (float)((ulong)in_stack_fffffffffffffc88 >> 0x20),SUB84(in_stack_fffffffffffffc88,0),
             0.0);
  pbrt::BoundSubtendedDirections
            (in_stack_fffffffffffffcf0,
             (Point3f *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  local_48 = local_a4;
  local_58 = local_b4;
  uStack_50 = uStack_ac;
  dVar8 = std::acos((double)(uStack_ac >> 0x20));
  local_c4 = SUB84(dVar8,0);
  dVar8 = sqrt(0.5);
  dVar8 = atan(dVar8 + dVar8);
  local_c8 = (float)dVar8;
  local_e0 = (double)local_c8 * 1.0001;
  testing::internal::CmpHelperGE<float,double>
            ((char *)CONCAT17(uVar1,in_stack_fffffffffffffd58),&this_02->success_,val1,val2);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
    in_stack_fffffffffffffd08 =
         (AssertionResult *)testing::AssertionResult::failure_message((AssertionResult *)0x6813ed);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcc0,
               (Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    testing::internal::AssertHelper::operator=(this_01,(Message *)in_stack_fffffffffffffd08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    testing::Message::~Message((Message *)0x681450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6814a5);
  local_108 = (double)local_c8 * 1.1;
  this_00 = local_100;
  testing::internal::CmpHelperLT<float,double>
            ((char *)CONCAT17(uVar1,in_stack_fffffffffffffd58),&this_02->success_,val1,val2);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
    in_stack_fffffffffffffcf0 =
         (Bounds3f *)testing::AssertionResult::failure_message((AssertionResult *)0x68155d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcc0,
               (Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    testing::internal::AssertHelper::operator=(this_01,(Message *)in_stack_fffffffffffffd08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    testing::Message::~Message((Message *)0x6815ba);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x681612);
  pbrt::RNG::RNG((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                 (uint64_t)in_stack_fffffffffffffc88);
  for (local_12c = 0; local_12c < 1000; local_12c = local_12c + 1) {
    fVar3 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    FVar4 = pbrt::Lerp(fVar3,-1.0,1.0);
    fVar3 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    FVar5 = pbrt::Lerp(fVar3,-1.0,1.0);
    fVar3 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    pbrt::Lerp(fVar3,-1.0,1.0);
    pbrt::Point3<float>::Point3
              ((Point3<float> *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (float)((ulong)in_stack_fffffffffffffc88 >> 0x20),SUB84(in_stack_fffffffffffffc88,0),
               0.0);
    fVar3 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    pbrt::Lerp(fVar3,-1.0,1.0);
    fVar3 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    pbrt::Lerp(fVar3,-1.0,1.0);
    fVar3 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    pbrt::Lerp(fVar3,-1.0,1.0);
    pbrt::Point3<float>::Point3
              ((Point3<float> *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (float)((ulong)in_stack_fffffffffffffc88 >> 0x20),SUB84(in_stack_fffffffffffffc88,0),
               0.0);
    pbrt::Bounds3<float>::Bounds3
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               (Point3<float> *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    fVar3 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    FVar6 = pbrt::Lerp(fVar3,-4.0,4.0);
    fVar3 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    FVar7 = pbrt::Lerp(fVar3,-4.0,4.0);
    fVar3 = pbrt::RNG::Uniform<float>
                      ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    pbrt::Lerp(fVar3,-4.0,4.0);
    pbrt::Point3<float>::Point3
              ((Point3<float> *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (float)((ulong)in_stack_fffffffffffffc88 >> 0x20),SUB84(in_stack_fffffffffffffc88,0),
               0.0);
    pbrt::BoundSubtendedDirections(in_stack_fffffffffffffcf0,(Point3f *)CONCAT44(FVar6,FVar7));
    local_58 = local_17c;
    uStack_50 = local_174;
    local_48 = local_16c;
    bVar2 = pbrt::Inside<float>(local_168,&local_144);
    if (bVar2) {
      dVar8 = std::cos(SUB648(ZEXT464(0x40490fdb),0));
      local_194 = SUB84(dVar8,0);
      in_stack_fffffffffffffcc8 = &local_190;
      testing::internal::EqHelper<false>::Compare<float,float>
                ((char *)in_stack_fffffffffffffca8,
                 (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                 (float *)in_stack_fffffffffffffc98,
                 (float *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
      in_stack_fffffffffffffcd7 =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffcc8);
      if (!(bool)in_stack_fffffffffffffcd7) {
        testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
        in_stack_fffffffffffffcc0 =
             (Bounds3<float> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x68191f);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffcc0,
                   (Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
        testing::internal::AssertHelper::operator=(this_01,(Message *)in_stack_fffffffffffffd08);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
        testing::Message::~Message((Message *)0x68197c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x6819d1);
    }
    else {
      pbrt::Vector3<float>::Vector3((Vector3<float> *)0x6819f5);
      pbrt::Vector3<float>::Vector3((Vector3<float> *)0x681a02);
      pbrt::CoordinateSystem<float>
                ((Vector3<float> *)in_stack_fffffffffffffcc0,
                 (Vector3<float> *)in_stack_fffffffffffffcb8,
                 (Vector3<float> *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      for (local_1cc[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
          (int)local_1cc[0].super_Tuple3<pbrt::Point3,_float>.z < 1000;
          local_1cc[0].super_Tuple3<pbrt::Point3,_float>.z =
               (float)((int)local_1cc[0].super_Tuple3<pbrt::Point3,_float>.z + 1)) {
        in_stack_fffffffffffffca8 = local_128;
        in_stack_fffffffffffffcb4 =
             pbrt::RNG::Uniform<float>
                       ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
        pbrt::RNG::Uniform<float>
                  ((RNG *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
        auVar10 = (undefined1  [56])0x0;
        in_stack_fffffffffffffcb8 = local_1cc;
        pbrt::Point2<float>::Point2
                  ((Point2<float> *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                   (float)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                   SUB84(in_stack_fffffffffffffc88,0));
        VVar11 = pbrt::SampleUniformSphere
                           ((Point2f *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                           );
        local_1e0 = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar9._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar9._8_56_ = auVar10;
        local_1e8 = vmovlpd_avx(auVar9._0_16_);
        local_1d8 = local_1e8;
        local_1d0 = local_1e0;
        pbrt::MediumHandle::TaggedPointer
                  ((MediumHandle *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                   in_stack_fffffffffffffc88);
        pbrt::Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,
                       (Vector3f *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                       (Float)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                       (MediumHandle *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90)
                      );
        local_219 = pbrt::Bounds3<float>::IntersectP
                              ((Bounds3<float> *)CONCAT44(FVar4,FVar5),
                               (Point3f *)
                               CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                               (Vector3f *)in_stack_fffffffffffffcc8,
                               (Float)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                               (Float *)in_stack_fffffffffffffcb8,
                               (Float *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0
                                                ));
        if ((bool)local_219) {
          pbrt::Inside((DirectionCone *)in_stack_fffffffffffffcc0,
                       (Vector3f *)in_stack_fffffffffffffcb8);
          in_stack_fffffffffffffc98 = &local_230;
          testing::AssertionResult::AssertionResult
                    ((AssertionResult *)
                     CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                     SUB81((ulong)in_stack_fffffffffffffc88 >> 0x38,0));
          in_stack_fffffffffffffca7 =
               testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc98);
          if (!(bool)in_stack_fffffffffffffca7) {
            testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (in_stack_fffffffffffffd08,(char *)CONCAT17(uVar1,in_stack_fffffffffffffd00),
                       &this_00->success_,(char *)in_stack_fffffffffffffcf0);
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffcc0,
                       (Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
            testing::internal::AssertHelper::operator=(this_01,(Message *)in_stack_fffffffffffffd08)
            ;
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90)
                      );
            std::__cxx11::string::~string(local_260);
            testing::Message::~Message((Message *)0x681c40);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x681cb8);
        }
        bVar2 = pbrt::Inside((DirectionCone *)in_stack_fffffffffffffcc0,
                             (Vector3f *)in_stack_fffffffffffffcb8);
        if (!bVar2) {
          in_stack_fffffffffffffc88 = &local_270;
          testing::AssertionResult::AssertionResult
                    ((AssertionResult *)
                     CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                     SUB81((ulong)in_stack_fffffffffffffc88 >> 0x38,0));
          in_stack_fffffffffffffc97 =
               testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc88);
          if (!(bool)in_stack_fffffffffffffc97) {
            testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (in_stack_fffffffffffffd08,(char *)CONCAT17(uVar1,in_stack_fffffffffffffd00),
                       &this_00->success_,(char *)in_stack_fffffffffffffcf0);
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffcc0,
                       (Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
            testing::internal::AssertHelper::operator=(this_01,(Message *)in_stack_fffffffffffffd08)
            ;
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90)
                      );
            std::__cxx11::string::~string(local_2a0);
            testing::Message::~Message((Message *)0x681de9);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x681e61);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(DirectionCone, BoundBounds) {
    Bounds3f b(Point3f(0, 0, 0), Point3f(1, 1, 1));

    // Point inside the bbox
    DirectionCone c = BoundSubtendedDirections(b, Point3f(.1, .2, .3));
    EXPECT_EQ(std::cos(Pi), c.cosTheta);

    // Outside, .5 units away in the middle (so using the direction to the
    // center gives the best bound).
    //
    // tan theta = (sqrt(.5^2 + .5^2)) / .5
    c = BoundSubtendedDirections(b, Point3f(-.5, .5, .5));
    Float theta = std::acos(c.cosTheta);
    Float precise = std::atan(std::sqrt(.5 * .5 + .5 * .5) / .5);
    // Make sure the returned bound isn't too small.
    EXPECT_GE(theta, 1.0001 * precise);
    // It's fine for it to be a bit big (as it is in practice due to
    // approximations for performance), but it shouldn't be too big.
    EXPECT_LT(theta, 1.1 * precise);

    RNG rng(512);
    for (int i = 0; i < 1000; ++i) {
        Bounds3f b(
            Point3f(Lerp(rng.Uniform<Float>(), -1, 1), Lerp(rng.Uniform<Float>(), -1, 1),
                    Lerp(rng.Uniform<Float>(), -1, 1)),
            Point3f(Lerp(rng.Uniform<Float>(), -1, 1), Lerp(rng.Uniform<Float>(), -1, 1),
                    Lerp(rng.Uniform<Float>(), -1, 1)));

        Point3f p(Lerp(rng.Uniform<Float>(), -4, 4), Lerp(rng.Uniform<Float>(), -4, 4),
                  Lerp(rng.Uniform<Float>(), -4, 4));

        c = BoundSubtendedDirections(b, p);
        if (Inside(p, b))
            EXPECT_EQ(std::cos(Pi), c.cosTheta);
        else {
            Vector3f wx, wy;
            CoordinateSystem(c.w, &wx, &wy);
            for (int j = 0; j < 1000; ++j) {
                Point2f u(rng.Uniform<Float>(), rng.Uniform<Float>());
                Vector3f w = SampleUniformSphere(u);
                Ray r(p, w);
                bool hit = b.IntersectP(r.o, r.d);
                if (hit)
                    EXPECT_TRUE(Inside(c, w));
                if (!Inside(c, w))
                    EXPECT_FALSE(hit);
            }
        }
    }
}